

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  undefined1 auVar1 [16];
  code *pcVar2;
  uint newSize;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  hash_t hVar6;
  undefined4 *puVar7;
  SimpleDictionaryEntry<void_*,_Js::IsInstInlineCache_*> *dst;
  long lVar8;
  long lVar9;
  size_t requestedBytes;
  int *local_48;
  int *newBuckets;
  SimpleDictionaryEntry<void_*,_Js::IsInstInlineCache_*> *pSStack_38;
  int modIndex;
  EntryType *newEntries;
  
  newSize = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  uVar4 = 4;
  if (8 < newSize) {
    uVar4 = this->count & 0x7fffffff;
  }
  uVar4 = PrimePolicy::GetPrime(uVar4,(int *)((long)&newBuckets + 4));
  local_48 = (Type)0x0;
  pSStack_38 = (SimpleDictionaryEntry<void_*,_Js::IsInstInlineCache_*> *)0x0;
  if (uVar4 == this->bucketCount) {
    if (newSize == 0) {
      dst = (SimpleDictionaryEntry<void_*,_Js::IsInstInlineCache_*> *)&DAT_00000008;
    }
    else {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)newSize;
      requestedBytes = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
        requestedBytes = SUB168(auVar1 * ZEXT816(0x18),0);
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_007cffaf;
        *puVar7 = 0;
      }
      if (requestedBytes == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                           "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar3) goto LAB_007cffaf;
        *puVar7 = 0;
      }
      dst = (SimpleDictionaryEntry<void_*,_Js::IsInstInlineCache_*> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset((char *)((long)&(dst->
                             super_DefaultHashedEntry<void_*,_Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             ).super_KeyValueEntry<void_*,_Js::IsInstInlineCache_*>.
                             super_ValueEntry<Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>_>
                             .super_KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>.value
                     + requestedBytes),0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (SimpleDictionaryEntry<void_*,_Js::IsInstInlineCache_*> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_007cffaf:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
    pSStack_38 = dst;
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,Js::IsInstInlineCache*>,Js::IsInstInlineCache*,Memory::ArenaAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = pSStack_38;
    this->size = newSize;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_48,&stack0xffffffffffffffc8,uVar4,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<void*,Js::IsInstInlineCache*>,Js::IsInstInlineCache*,Memory::ArenaAllocator>
              (pSStack_38,(long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    if (0 < this->count) {
      lVar8 = 8;
      lVar9 = 0;
      do {
        if (-2 < *(int *)((long)&(pSStack_38->
                                 super_DefaultHashedEntry<void_*,_Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 ).super_KeyValueEntry<void_*,_Js::IsInstInlineCache_*>.
                                 super_ValueEntry<Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>_>
                                 .super_KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>.
                                 value + lVar8)) {
          hVar6 = PrimePolicy::ModPrime
                            ((uint)(*(ulong *)((long)&(pSStack_38->
                                                                                                            
                                                  super_DefaultHashedEntry<void_*,_Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                                  ).
                                                  super_KeyValueEntry<void_*,_Js::IsInstInlineCache_*>
                                                  .
                                                  super_ValueEntry<Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>_>
                                                  .
                                                  super_KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>
                                                  .next + lVar8) >> 4) & 0x7fffffff,uVar4,
                             this->modFunctionIndex);
          *(int *)((long)&(pSStack_38->
                          super_DefaultHashedEntry<void_*,_Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          ).super_KeyValueEntry<void_*,_Js::IsInstInlineCache_*>.
                          super_ValueEntry<Js::IsInstInlineCache_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>_>
                          .super_KeyValueEntryDataLayout2<void_*,_Js::IsInstInlineCache_*>.value +
                  lVar8) = local_48[(int)hVar6];
          local_48[(int)hVar6] = (int)lVar9;
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar9 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = pSStack_38;
    this->bucketCount = uVar4;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }